

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

wchar_t cmp_distance(void *a,void *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  wchar_t wVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar1 = (player->grid).x;
  iVar2 = (player->grid).y;
  uVar5 = *a - iVar1;
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar6 = *(int *)((long)a + 4) - iVar2;
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  uVar6 = uVar3 + uVar5 * 2;
  if (uVar5 < uVar3) {
    uVar6 = uVar5 + uVar3 * 2;
  }
  uVar5 = *b - iVar1;
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar7 = *(int *)((long)b + 4) - iVar2;
  uVar5 = -uVar7;
  if (0 < (int)uVar7) {
    uVar5 = uVar7;
  }
  uVar7 = uVar3 + uVar5 * 2;
  if (uVar5 < uVar3) {
    uVar7 = uVar5 + uVar3 * 2;
  }
  wVar4 = L'\xffffffff';
  if (uVar7 <= uVar6) {
    wVar4 = (uint)(uVar7 < uVar6);
  }
  return wVar4;
}

Assistant:

int cmp_distance(const void *a, const void *b)
{
	int py = player->grid.y;
	int px = player->grid.x;

	const struct loc *pa = a;
	const struct loc *pb = b;

	int da, db, kx, ky;

	/* Absolute distance components */
	kx = pa->x; kx -= px; kx = ABS(kx);
	ky = pa->y; ky -= py; ky = ABS(ky);

	/* Approximate Double Distance to the first point */
	da = ((kx > ky) ? (kx + kx + ky) : (ky + ky + kx));

	/* Absolute distance components */
	kx = pb->x; kx -= px; kx = ABS(kx);
	ky = pb->y; ky -= py; ky = ABS(ky);

	/* Approximate Double Distance to the first point */
	db = ((kx > ky) ? (kx + kx + ky) : (ky + ky + kx));

	/* Compare the distances */
	if (da < db)
		return -1;
	if (da > db)
		return 1;
	return 0;
}